

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_perform_authentication(connectdata *conn)

{
  saslstate *sasl;
  _Bool _Var1;
  CURLcode CVar2;
  undefined8 in_RAX;
  saslprogress progress;
  saslprogress local_14;
  
  local_14 = (saslprogress)((ulong)in_RAX >> 0x20);
  if ((conn->proto).imapc.resptag[2] == '\x01') {
    sasl = &(conn->proto).imapc.sasl.state;
    _Var1 = Curl_sasl_can_authenticate((SASL *)sasl,conn);
    if (_Var1) {
      CVar2 = Curl_sasl_start((SASL *)sasl,conn,false,&local_14);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      if (local_14 == SASL_INPROGRESS) {
        (conn->proto).imapc.state = IMAP_LOGIN;
        return CURLE_OK;
      }
      Curl_infof(conn->data,"No known authentication mechanisms supported!\n");
      return CURLE_LOGIN_DENIED;
    }
  }
  (conn->proto).imapc.state = IMAP_STOP;
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  saslprogress progress;

  /* Check we have enough data to authenticate with, and the
     server supports authentiation, and end the connect phase if not */
  if(!smtpc->auth_supported ||
     !Curl_sasl_can_authenticate(&smtpc->sasl, conn)) {
    state(conn, SMTP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&smtpc->sasl, conn, FALSE, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      state(conn, SMTP_AUTH);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}